

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::EnumValueDescriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,EnumValueDescriptor *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  DebugString(this,0,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string EnumValueDescriptor::DebugString() const {
  string contents;
  DebugString(0, &contents);
  return contents;
}